

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurtainWallType::IfcCurtainWallType(IfcCurtainWallType *this)

{
  IfcCurtainWallType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcCurtainWallType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__010bff00);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>,
             &PTR_construction_vtable_24__010c0038);
  *(undefined8 *)this = 0x10bfdd0;
  *(undefined8 *)&this->field_0x1c0 = 0x10bfee8;
  *(undefined8 *)&this->field_0x88 = 0x10bfdf8;
  *(undefined8 *)&this->field_0x98 = 0x10bfe20;
  *(undefined8 *)&this->field_0xf0 = 0x10bfe48;
  *(undefined8 *)&this->field_0x148 = 0x10bfe70;
  *(undefined8 *)&this->field_0x180 = 0x10bfe98;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10bfec0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcCurtainWallType() : Object("IfcCurtainWallType") {}